

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  InplaceStr *pIVar1;
  bool bVar2;
  ulong uVar3;
  InplaceStr local_68;
  InplaceStr *local_58;
  InplaceStr *item;
  char *pcStack_48;
  uint i;
  char *local_40;
  InplaceStrHasher local_31;
  uint local_30;
  uint local_2c;
  uint bucket;
  uint bucketMask;
  InplaceStr *local_18;
  InplaceStr *key_local;
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this_local;
  
  local_18 = key;
  key_local = (InplaceStr *)this;
  InplaceStr::InplaceStr((InplaceStr *)&bucket);
  bVar2 = InplaceStr::operator!=(key,(InplaceStr *)&bucket);
  if (!bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<InplaceStr, InplaceStrHasher, 2>::insert(const Key &) [Key = InplaceStr, Hasher = InplaceStrHasher, N = 2]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_2c = this->bucketCount - 1;
  pcStack_48 = local_18->begin;
  local_40 = local_18->end;
  local_30 = InplaceStrHasher::operator()(&local_31,*local_18);
  local_30 = local_30 & local_2c;
  item._4_4_ = 0;
  while( true ) {
    if (this->bucketCount <= item._4_4_) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<InplaceStr, InplaceStrHasher, 2>::insert(const Key &) [Key = InplaceStr, Hasher = InplaceStrHasher, N = 2]"
                   );
    }
    pIVar1 = this->data;
    uVar3 = (ulong)local_30;
    local_58 = pIVar1 + uVar3;
    InplaceStr::InplaceStr(&local_68);
    bVar2 = InplaceStr::operator==(pIVar1 + uVar3,&local_68);
    if (bVar2) break;
    bVar2 = InplaceStr::operator==(local_58,local_18);
    if (bVar2) {
      return;
    }
    local_30 = local_30 + item._4_4_ + 1 & local_2c;
    item._4_4_ = item._4_4_ + 1;
  }
  local_58->begin = local_18->begin;
  local_58->end = local_18->end;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}